

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_finish_entry(archive_write *a)

{
  compression cVar1;
  uint16_t uVar2;
  int iVar3;
  wchar_t wVar4;
  size_t in_len;
  time_t tVar5;
  uchar *__dest;
  uint32_t local_128;
  uint32_t local_118;
  uint32_t local_108;
  uchar *zd;
  uchar *z;
  uchar zip64 [32];
  uchar *ud;
  uchar *u;
  undefined1 local_9d;
  undefined1 auStack_9c [3];
  uchar ut [9];
  char d [24];
  size_t hmac_len;
  uint8_t hmac [20];
  size_t outl_2;
  size_t remainder_2;
  size_t outl_1;
  size_t zret;
  size_t remainder_1;
  size_t outl;
  size_t remainder;
  char finishing;
  zip_conflict *pzStack_20;
  int ret;
  zip_conflict *zip;
  archive_write *a_local;
  
  pzStack_20 = (zip_conflict *)a->format_data;
  cVar1 = pzStack_20->entry_compression;
  zip = (zip_conflict *)a;
  if (cVar1 == COMPRESSION_DEFLATE) {
    while( true ) {
      remainder._4_4_ = deflate(&pzStack_20->stream,4);
      if (remainder._4_4_ == -2) {
        return -0x1e;
      }
      outl = pzStack_20->len_buf - (ulong)(pzStack_20->stream).lzma.options.lp;
      if (pzStack_20->tctx_valid == '\0') {
        if (pzStack_20->cctx_valid != '\0') {
          remainder_1 = outl;
          remainder._4_4_ =
               aes_ctr_update(&pzStack_20->cctx,pzStack_20->buf,outl,pzStack_20->buf,&remainder_1);
          if (remainder._4_4_ < 0) {
            archive_set_error((archive *)zip,-1,"Failed to encrypt file");
            return -0x19;
          }
          __hmac_sha1_update(&pzStack_20->hctx,pzStack_20->buf,outl);
        }
      }
      else {
        trad_enc_encrypt_update(&pzStack_20->tctx,pzStack_20->buf,outl,pzStack_20->buf,outl);
      }
      remainder._4_4_ = __archive_write_output((archive_write *)zip,pzStack_20->buf,outl);
      if (remainder._4_4_ != 0) {
        return remainder._4_4_;
      }
      pzStack_20->entry_compressed_written = outl + pzStack_20->entry_compressed_written;
      pzStack_20->written_bytes = outl + pzStack_20->written_bytes;
      (pzStack_20->stream).deflate.next_out = pzStack_20->buf;
      if ((pzStack_20->stream).lzma.options.lp != 0) break;
      (pzStack_20->stream).lzma.options.lp = (uint32_t)pzStack_20->len_buf;
      remainder._4_4_ = 0;
    }
    deflateEnd(&pzStack_20->stream);
    goto LAB_001ad4aa;
  }
  if (cVar1 != COMPRESSION_LZMA) {
    if (cVar1 == COMPRESSION_ZSTD) {
      remainder._3_1_ = '\x01';
      iVar3 = remainder._4_4_;
      do {
        remainder._4_4_ = iVar3;
        outl_1 = ZSTD_endStream((pzStack_20->stream).deflate.next_in,
                                (undefined1 *)((long)&pzStack_20->stream + 0x20));
        if (outl_1 == 0) {
          remainder._3_1_ = '\0';
        }
        else {
          iVar3 = ZSTD_isError(outl_1);
          if (iVar3 != 0) {
            return -0x1e;
          }
        }
        zret = pzStack_20->len_buf -
               ((pzStack_20->stream).zstd.out.size - (long)(pzStack_20->stream).deflate.msg);
        if (pzStack_20->tctx_valid == '\0') {
          if (pzStack_20->cctx_valid != '\0') {
            remainder_2 = zret;
            remainder._4_4_ =
                 aes_ctr_update(&pzStack_20->cctx,pzStack_20->buf,zret,pzStack_20->buf,&remainder_2)
            ;
            if (remainder._4_4_ < 0) {
              archive_set_error((archive *)zip,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update(&pzStack_20->hctx,pzStack_20->buf,zret);
          }
        }
        else {
          trad_enc_encrypt_update(&pzStack_20->tctx,pzStack_20->buf,zret,pzStack_20->buf,zret);
        }
        remainder._4_4_ = __archive_write_output((archive_write *)zip,pzStack_20->buf,zret);
        if (remainder._4_4_ != 0) {
          return remainder._4_4_;
        }
        pzStack_20->entry_compressed_written = zret + pzStack_20->entry_compressed_written;
        pzStack_20->written_bytes = zret + pzStack_20->written_bytes;
        (pzStack_20->stream).zstd.out.dst = pzStack_20->buf;
        if ((pzStack_20->stream).deflate.msg != (char *)(pzStack_20->stream).deflate.total_out) {
          remainder._3_1_ = '\0';
        }
        (pzStack_20->stream).deflate.total_out = pzStack_20->len_buf;
        iVar3 = 0;
      } while (remainder._3_1_ != '\0');
      ZSTD_freeCStream((pzStack_20->stream).deflate.next_in);
      goto LAB_001ad4aa;
    }
    if (cVar1 != COMPRESSION_XZ) goto LAB_001ad4aa;
  }
  remainder._3_1_ = '\x01';
  iVar3 = remainder._4_4_;
  do {
    remainder._4_4_ = iVar3;
    remainder._4_4_ = lzma_code((undefined1 *)((long)&pzStack_20->stream + 0x78),3);
    if (remainder._4_4_ == 1) {
      remainder._3_1_ = '\0';
    }
    else if (remainder._4_4_ == 5) {
      return -0x1e;
    }
    in_len = pzStack_20->len_buf - (pzStack_20->stream).lzma.context.avail_out;
    if (pzStack_20->tctx_valid == '\0') {
      if (pzStack_20->cctx_valid != '\0') {
        unique0x10000daf = in_len;
        remainder._4_4_ =
             aes_ctr_update(&pzStack_20->cctx,pzStack_20->buf,in_len,pzStack_20->buf,
                            (size_t *)(hmac + 0x10));
        if (remainder._4_4_ < 0) {
          archive_set_error((archive *)zip,-1,"Failed to encrypt file");
          return -0x19;
        }
        __hmac_sha1_update(&pzStack_20->hctx,pzStack_20->buf,in_len);
      }
    }
    else {
      trad_enc_encrypt_update(&pzStack_20->tctx,pzStack_20->buf,in_len,pzStack_20->buf,in_len);
    }
    remainder._4_4_ = __archive_write_output((archive_write *)zip,pzStack_20->buf,in_len);
    if (remainder._4_4_ != 0) {
      return remainder._4_4_;
    }
    pzStack_20->entry_compressed_written = in_len + pzStack_20->entry_compressed_written;
    pzStack_20->written_bytes = in_len + pzStack_20->written_bytes;
    (pzStack_20->stream).lzma.context.next_out = pzStack_20->buf;
    if ((pzStack_20->stream).lzma.context.avail_out != 0) {
      remainder._3_1_ = '\0';
    }
    (pzStack_20->stream).lzma.context.avail_out = pzStack_20->len_buf & 0xffffffff;
    iVar3 = 0;
  } while (remainder._3_1_ != '\0');
  lzma_end((undefined1 *)((long)&pzStack_20->stream + 0x78));
LAB_001ad4aa:
  if (pzStack_20->hctx_valid != '\0') {
    d[0x10] = '\x14';
    d[0x11] = '\0';
    d[0x12] = '\0';
    d[0x13] = '\0';
    d[0x14] = '\0';
    d[0x15] = '\0';
    d[0x16] = '\0';
    d[0x17] = '\0';
    __hmac_sha1_final(&pzStack_20->hctx,(uint8_t *)&hmac_len,(size_t *)(d + 0x10));
    iVar3 = __archive_write_output((archive_write *)zip,&hmac_len,10);
    if (iVar3 != 0) {
      return iVar3;
    }
    pzStack_20->entry_compressed_written = pzStack_20->entry_compressed_written + 10;
    pzStack_20->written_bytes = pzStack_20->written_bytes + 10;
    remainder._4_4_ = 0;
  }
  if ((pzStack_20->entry_flags & 8U) != 0) {
    builtin_memcpy(ut + 1,"PK\a\b",4);
    if ((pzStack_20->cctx_valid == '\0') || (pzStack_20->aes_vendor != 2)) {
      archive_le32enc(ut + 5,pzStack_20->entry_crc32);
    }
    else {
      archive_le32enc(ut + 5,0);
    }
    if (((pzStack_20->entry_compressed_written < 0x100000000) &&
        (pzStack_20->entry_uncompressed_written < 0x100000000)) && ((pzStack_20->flags & 2U) == 0))
    {
      archive_le32enc(d,(uint32_t)pzStack_20->entry_compressed_written);
      archive_le32enc(d + 4,(uint32_t)pzStack_20->entry_uncompressed_written);
      remainder._4_4_ = __archive_write_output((archive_write *)zip,ut + 1,0x10);
      pzStack_20->written_bytes = pzStack_20->written_bytes + 0x10;
    }
    else {
      archive_le64enc(d,pzStack_20->entry_compressed_written);
      archive_le64enc(d + 8,pzStack_20->entry_uncompressed_written);
      remainder._4_4_ = __archive_write_output((archive_write *)zip,ut + 1,0x18);
      pzStack_20->written_bytes = pzStack_20->written_bytes + 0x18;
    }
    if (remainder._4_4_ != 0) {
      return -0x1e;
    }
  }
  wVar4 = archive_entry_mtime_is_set(pzStack_20->entry);
  if (wVar4 != L'\0') {
    stack0xffffffffffffff5f = 0x55455;
    local_9d = 1;
    tVar5 = archive_entry_mtime(pzStack_20->entry);
    archive_le32enc(auStack_9c,(uint32_t)tVar5);
    zip64._24_8_ = cd_alloc(pzStack_20,(size_t)(ut + (1 - ((long)&u + 7))));
    if ((uchar *)zip64._24_8_ == (uchar *)0x0) {
      archive_set_error((archive *)zip,0xc,"Can\'t allocate zip data");
      return -0x1e;
    }
    memcpy((void *)zip64._24_8_,(void *)((long)&u + 7),(size_t)(ut + (1 - ((long)&u + 7))));
  }
  if ((pzStack_20->cctx_valid == '\0') || (pzStack_20->aes_vendor != 2)) {
    archive_le32enc(pzStack_20->file_header + 0x10,pzStack_20->entry_crc32);
  }
  else {
    archive_le32enc(pzStack_20->file_header + 0x10,0);
  }
  archive_le32enc(pzStack_20->file_header + 0x14,(uint32_t)pzStack_20->entry_compressed_written);
  archive_le32enc(pzStack_20->file_header + 0x18,(uint32_t)pzStack_20->entry_uncompressed_written);
  archive_le16enc(pzStack_20->file_header + 0x1e,
                  (short)pzStack_20->central_directory_bytes -
                  (short)pzStack_20->file_header_extra_offset);
  archive_le32enc(pzStack_20->file_header + 0x2a,(uint32_t)pzStack_20->entry_offset);
  if (((0xfffffffe < pzStack_20->entry_compressed_written) ||
      (0xfffffffe < pzStack_20->entry_uncompressed_written)) ||
     (0xffffffff < pzStack_20->entry_offset)) {
    z._0_4_ = 1;
    zd = (uchar *)((long)&z + 4);
    if (0xfffffffe < pzStack_20->entry_uncompressed_written) {
      archive_le32enc(pzStack_20->file_header + 0x18,0xffffffff);
      archive_le64enc(zd,pzStack_20->entry_uncompressed_written);
      zd = zip64 + 4;
    }
    if (0xfffffffe < pzStack_20->entry_compressed_written) {
      archive_le32enc(pzStack_20->file_header + 0x14,0xffffffff);
      archive_le64enc(zd,pzStack_20->entry_compressed_written);
      zd = zd + 8;
    }
    if (0xfffffffe < pzStack_20->entry_offset) {
      archive_le32enc(pzStack_20->file_header + 0x2a,0xffffffff);
      archive_le64enc(zd,pzStack_20->entry_offset);
      zd = zd + 8;
    }
    archive_le16enc((void *)((long)&z + 2),(short)zd - ((short)&z + 4));
    __dest = cd_alloc(pzStack_20,(long)zd - (long)&z);
    if (__dest == (uchar *)0x0) {
      archive_set_error((archive *)zip,0xc,"Can\'t allocate zip data");
      return -0x1e;
    }
    memcpy(__dest,&z,(long)zd - (long)&z);
    uVar2 = archive_le16dec(pzStack_20->file_header + 6);
    if (uVar2 < 0x2d) {
      archive_le16enc(pzStack_20->file_header + 6,0x2d);
    }
  }
  if ((pzStack_20->cctx_valid == '\0') || (pzStack_20->aes_vendor != 2)) {
    archive_le32enc(pzStack_20->file_header + 0x10,pzStack_20->entry_crc32);
  }
  else {
    archive_le32enc(pzStack_20->file_header + 0x10,0);
  }
  if (pzStack_20->entry_compressed_written < 0x100000000) {
    local_108 = (uint32_t)pzStack_20->entry_compressed_written;
  }
  else {
    local_108 = 0xffffffff;
  }
  archive_le32enc(pzStack_20->file_header + 0x14,local_108);
  if (pzStack_20->entry_uncompressed_written < 0x100000000) {
    local_118 = (uint32_t)pzStack_20->entry_uncompressed_written;
  }
  else {
    local_118 = 0xffffffff;
  }
  archive_le32enc(pzStack_20->file_header + 0x18,local_118);
  archive_le16enc(pzStack_20->file_header + 0x1e,
                  (short)pzStack_20->central_directory_bytes -
                  (short)pzStack_20->file_header_extra_offset);
  if (pzStack_20->entry_offset < 0x100000000) {
    local_128 = (uint32_t)pzStack_20->entry_offset;
  }
  else {
    local_128 = 0xffffffff;
  }
  archive_le32enc(pzStack_20->file_header + 0x2a,local_128);
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;
#if defined(HAVE_BZLIB_H) || (defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream) || HAVE_LZMA_H
	char finishing;
#endif

	switch (zip->entry_compression) {
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		for (;;) {
			size_t remainder;

			ret = deflate(&zip->stream.deflate, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.deflate.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.deflate.next_out = zip->buf;
			if (zip->stream.deflate.avail_out != 0)
				break;
			zip->stream.deflate.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream.deflate);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		finishing = 1;
		do {
			size_t remainder;

			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_FINISH);
			if (ret == BZ_STREAM_END)
				finishing = 0;
			else if (ret != BZ_RUN_OK && ret != BZ_FINISH_OK)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.bzip2.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.bzip2.next_out = (char*)zip->buf;
			if (zip->stream.bzip2.avail_out != 0)
				finishing = 0;
			zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		BZ2_bzCompressEnd(&zip->stream.bzip2);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		finishing = 1;
		do {
			size_t remainder;

			size_t zret = ZSTD_endStream(zip->stream.zstd.context, &zip->stream.zstd.out);
			if (zret == 0)
				finishing = 0;
			else if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - (zip->stream.zstd.out.size - zip->stream.zstd.out.pos);
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.zstd.out.dst = zip->buf;
			if (zip->stream.zstd.out.pos != zip->stream.zstd.out.size)
				finishing = 0;
			zip->stream.zstd.out.size = zip->len_buf;
		} while (finishing);
		ZSTD_freeCStream(zip->stream.zstd.context);
		break;
#endif
#ifdef HAVE_LZMA_H
	/* XZ and LZMA share clean-up code */
	case COMPRESSION_LZMA:
	case COMPRESSION_XZ:
		finishing = 1;
		do {
			size_t remainder;

			ret = lzma_code(&zip->stream.lzma.context, LZMA_FINISH);
			if (ret == LZMA_STREAM_END)
				finishing = 0;
			else if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.lzma.context.avail_out;
			if (zip->tctx_valid) {
				trad_enc_encrypt_update(&zip->tctx,
				    zip->buf, remainder, zip->buf, remainder);
			} else if (zip->cctx_valid) {
				size_t outl = remainder;
				ret = archive_encrypto_aes_ctr_update(
				    &zip->cctx, zip->buf, remainder,
				    zip->buf, &outl);
				if (ret < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to encrypt file");
					return (ARCHIVE_FAILED);
				}
				archive_hmac_sha1_update(&zip->hctx,
				    zip->buf, remainder);
			}
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.lzma.context.next_out = zip->buf;
			if (zip->stream.lzma.context.avail_out != 0)
				finishing = 0;
			zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
		} while (finishing);
		lzma_end(&zip->stream.lzma.context);
		break;
#endif
	default:
		break;
	}
	if (zip->hctx_valid) {
		uint8_t hmac[20];
		size_t hmac_len = 20;

		archive_hmac_sha1_final(&zip->hctx, hmac, &hmac_len);
		ret = __archive_write_output(a, hmac, AUTH_CODE_SIZE);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->entry_compressed_written += AUTH_CODE_SIZE;
		zip->written_bytes += AUTH_CODE_SIZE;
	}

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
			archive_le32enc(d + 4, 0);/* no CRC.*/
		else
			archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_compressed_written > ZIP_4GB_MAX
		    || zip->entry_uncompressed_written > ZIP_4GB_MAX
		    || zip->flags & ZIP_FLAG_FORCE_ZIP64) {
			archive_le64enc(d + 8,
				(uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16,
				(uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8,
				(uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12,
				(uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* UT timestamp: Info-Zip specifies that _only_ the mtime should
	 * be recorded here; ctime and atime are also included in the
	 * local file descriptor. */
	if (archive_entry_mtime_is_set(zip->entry)) {
		unsigned char ut[9];
		unsigned char *u = ut, *ud;
		memcpy(u, "UT\005\000\001", 5);
		u += 5;
		archive_le32enc(u, (uint32_t)archive_entry_mtime(zip->entry));
		u += 4;
		ud = cd_alloc(zip, u - ut);
		if (ud == NULL) {
			archive_set_error(&a->archive, ENOMEM,
					  "Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(ud, ut, u - ut);
	}

	/* Fill in size information in the central directory entry. */
	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	/* Truncate to 32 bits; we'll fix up below. */
	archive_le32enc(zip->file_header + 20, (uint32_t)zip->entry_compressed_written);
	archive_le32enc(zip->file_header + 24, (uint32_t)zip->entry_uncompressed_written);
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42, (uint32_t)zip->entry_offset);

	/* If any of the values immediately above are too large, we'll
	 * need to put the corresponding value in a Zip64 extra field
	 * and set the central directory value to 0xffffffff as a flag. */
	if (zip->entry_compressed_written >= ZIP_4GB_MAX
	    || zip->entry_uncompressed_written >= ZIP_4GB_MAX
	    || zip->entry_offset > ZIP_4GB_MAX) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 24, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 20, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ZIP_4GB_MAX) {
			archive_le32enc(zip->file_header + 42, ZIP_4GB_MAX);
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, (uint16_t)(z - (zip64 + 4)));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	if (zip->cctx_valid && zip->aes_vendor == AES_VENDOR_AE_2)
		archive_le32enc(zip->file_header + 16, 0);/* no CRC.*/
	else
		archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
		(uint32_t)zipmin(zip->entry_compressed_written,
				 ZIP_4GB_MAX));
	archive_le32enc(zip->file_header + 24,
		(uint32_t)zipmin(zip->entry_uncompressed_written,
				 ZIP_4GB_MAX));
	archive_le16enc(zip->file_header + 30,
	    (uint16_t)(zip->central_directory_bytes - zip->file_header_extra_offset));
	archive_le32enc(zip->file_header + 42,
		(uint32_t)zipmin(zip->entry_offset,
				 ZIP_4GB_MAX));

	return (ARCHIVE_OK);
}